

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifinpevt(bifcxdef *ctx,int argc)

{
  uchar **ppuVar1;
  runsdef *prVar2;
  runcxdef *prVar3;
  uint16_t tmp_2;
  int iVar4;
  int unaff_EBP;
  int32_t tmp_1;
  os_event_info_t *poVar5;
  uint16_t tmp;
  ushort uVar6;
  anon_union_8_4_1dda36f5_for_runsv unaff_R14;
  runsdef val;
  char keyname [20];
  os_event_info_t info;
  
  if (argc == 0) {
    unaff_R14.runsvnum = 0;
    unaff_EBP = 0;
  }
  else if (0 < argc) {
    prVar2 = ctx->bifcxrun->runcxsp;
    ctx->bifcxrun->runcxsp = prVar2 + -1;
    prVar3 = ctx->bifcxrun;
    if (prVar2[-1].runstyp != '\x01') {
      prVar3->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    if (argc != 1) {
      prVar3->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x401);
    }
    unaff_R14 = prVar3->runcxsp->runsv;
    unaff_EBP = 1;
  }
  outflushn(0);
  outreset();
  poVar5 = &info;
  iVar4 = os_get_event(unaff_R14.runsvnum,unaff_EBP,poVar5);
  if (iVar4 == 3) {
LAB_00125a09:
    unaff_R14.runsvnum = strlen(poVar5->href);
    uVar6 = unaff_R14.runsvobj + 10;
  }
  else {
    if (iVar4 == 1) {
      poVar5 = (os_event_info_t *)keyname;
      get_ext_key_name(poVar5->href,info.key[0],info.key[1]);
      goto LAB_00125a09;
    }
    uVar6 = 7;
  }
  prVar3 = ctx->bifcxrun;
  val.runsv = (anon_union_8_4_1dda36f5_for_runsv)prVar3->runcxhp;
  if ((uint)(*(int *)&prVar3->runcxhtop - (int)val.runsv.runsvnum) <= (uint)uVar6) {
    runhcmp(prVar3,(uint)uVar6,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
    val.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
  }
  val.runstyp = '\a';
  *(ushort *)val.runsv.runsvstr = uVar6;
  *(uchar *)(val.runsv.runsvnum + 2) = '\x01';
  *(int *)(val.runsv.runsvnum + 3) = iVar4;
  if (iVar4 == 3) {
    *(uchar *)(val.runsv.runsvnum + 7) = '\x03';
    *(objnum *)(val.runsv.runsvnum + 8) = unaff_R14.runsvobj + 2;
    poVar5 = &info;
  }
  else {
    if (iVar4 != 1) goto LAB_00125aa6;
    *(uchar *)(val.runsv.runsvnum + 7) = '\x03';
    *(objnum *)(val.runsv.runsvnum + 8) = unaff_R14.runsvobj + 2;
    poVar5 = (os_event_info_t *)keyname;
  }
  memcpy((ushort *)(val.runsv.runsvnum + 10),poVar5,unaff_R14.runsvnum);
LAB_00125aa6:
  ppuVar1 = &ctx->bifcxrun->runcxhp;
  *ppuVar1 = *ppuVar1 + uVar6;
  runrepush(ctx->bifcxrun,&val);
  return;
}

Assistant:

void bifinpevt(bifcxdef *ctx, int argc)
{
    unsigned long timeout;
    int use_timeout;
    os_event_info_t info;
    int evt;
    uchar *p;
    ushort lstsiz;
    runsdef val;
    size_t paramlen;
    char keyname[20];
    
    /* check for a timeout value */
    if (argc == 0)
    {
        /* there's no timeout */
        use_timeout = FALSE;
        timeout = 0;
    }
    else if (argc >= 1)
    {
        /* get the timeout value */
        use_timeout = TRUE;
        timeout = (unsigned long)runpopnum(ctx->bifcxrun);
    }

    /* ensure we don't have too many arguments */
    if (argc > 1)
        runsig(ctx->bifcxrun, ERR_BIFARGC);

    /* flush any pending output */
    tioflushn(ctx->bifcxtio, 0);

    /* reset count of lines since keyboard input */
    tioreset(ctx->bifcxtio);

    /* ask the OS code for an event */
    evt = os_get_event(timeout, use_timeout, &info);

    /* 
     *   the list always minimally needs two bytes of length prefix plus a
     *   number with the event code (one byte for the type, four bytes for
     *   the value) 
     */
    lstsiz = 2 + (1 + 4);

    /* figure out how much space we'll need based on the event type */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* 
         *   we need space for a string with one or two bytes (depending
         *   on whether or not we have an extended key code) - 1 byte for
         *   type code, 2 for length prefix, and 1 or 2 for the string's
         *   contents 
         */
        paramlen = (info.key[0] == 0 ? 2 : 1);

        /* map the extended key */
        get_ext_key_name(keyname, info.key[0], info.key[1]);

        /* determine the length we need for the string */
        paramlen = strlen(keyname);

        /* add it into the list */
        lstsiz += 1 + 2 + paramlen;
        break;

    case OS_EVT_HREF:
        /* 
         *   we need space for the href string - 1 byte for type code, 2
         *   for length prefix, plus the string's contents 
         */
        paramlen = strlen(info.href);
        lstsiz += 1 + 2 + (ushort)paramlen;
        break;

    default:
        /* other event types have no extra data */
        break;
    }

    /* allocate space for the list */
    runhres(ctx->bifcxrun, lstsiz, 0);

    /* set up the stack value */
    val.runstyp = DAT_LIST;
    p = val.runsv.runsvstr = ctx->bifcxrun->runcxhp;

    /* set up the list length prefix */
    oswp2(p, lstsiz);
    p += 2;

    /* set up the event type element */
    *p++ = DAT_NUMBER;
    oswp4s(p, evt);
    p += 4;

    /* add the event parameters, if any */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* set up the string for the key */
        *p++ = DAT_SSTRING;
        oswp2(p, paramlen + 2);
        p += 2;

        /* add the characters to the string */
        memcpy(p, keyname, paramlen);
        p += paramlen;
        break;

    case OS_EVT_HREF:
        /* add the string for the href */
        *p++ = DAT_SSTRING;
        oswp2(p, paramlen + 2);
        memcpy(p + 2, info.href, paramlen);
        break;
    }

    /* consume the heap space */
    ctx->bifcxrun->runcxhp += lstsiz;

    /* push the result */
    runrepush(ctx->bifcxrun, &val);
}